

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::MatrixBandPartLayerParams::MatrixBandPartLayerParams
          (MatrixBandPartLayerParams *this,MatrixBandPartLayerParams *from)

{
  void *pvVar1;
  int64 iVar2;
  
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__MatrixBandPartLayerParams_0040f538;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  iVar2 = from->numupper_;
  this->numlower_ = from->numlower_;
  this->numupper_ = iVar2;
  return;
}

Assistant:

MatrixBandPartLayerParams::MatrixBandPartLayerParams(const MatrixBandPartLayerParams& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::memcpy(&numlower_, &from.numlower_,
    reinterpret_cast<char*>(&numupper_) -
    reinterpret_cast<char*>(&numlower_) + sizeof(numupper_));
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.MatrixBandPartLayerParams)
}